

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.cpp
# Opt level: O2

uint __thiscall Reap::pop(Reap *this)

{
  pointer *ppuVar1;
  uint in_EAX;
  uint uVar2;
  uint uVar3;
  iterator p;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  iterator p_1;
  uint *puVar8;
  uint other;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  uint *local_48;
  ulong local_40;
  uint *local_38;
  
  uVar3 = this->min_bucket;
  local_40 = (ulong)uVar3;
  do {
    uVar4 = local_40 & 0xffffffff;
    puVar6 = this->buckets[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = this->buckets[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar6 == puVar7) {
      uVar3 = (int)local_40 + 1;
      local_40 = (ulong)uVar3;
      this->min_bucket = uVar3;
    }
    else {
      local_50 = this->buckets + uVar4;
      local_48 = puVar6;
      if ((int)local_40 == 0) {
        in_EAX = this->last_deleted;
        ppuVar1 = &this->buckets[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
      else {
        in_EAX = 0xffffffff;
        puVar8 = puVar6;
        for (puVar5 = puVar6; local_38 = puVar7, puVar5 != puVar7; puVar5 = puVar5 + 1) {
          if (*puVar5 < in_EAX) {
            in_EAX = *puVar5;
            puVar8 = puVar5;
          }
        }
        for (; puVar6 != puVar7; puVar6 = puVar6 + 1) {
          if (puVar6 != puVar8) {
            other = *puVar6;
            uVar3 = other ^ in_EAX;
            uVar2 = 0x20;
            if (uVar3 != 0) {
              uVar2 = 0x1f;
              if (uVar3 != 0) {
                for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                }
              }
              uVar2 = uVar2 ^ 0x1f;
            }
            uVar2 = 0x20 - uVar2;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (this->buckets + uVar2,&other);
            puVar7 = local_38;
            uVar3 = this->min_bucket;
            if (uVar2 < this->min_bucket) {
              this->min_bucket = uVar2;
              uVar3 = uVar2;
            }
          }
        }
        puVar6 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if ((local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar6) {
          (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = puVar6;
        }
        if (this->max_bucket == (uint)local_40) {
          this->max_bucket = (uint)local_40 - 1;
        }
      }
      uVar2 = (uint)local_40;
      if ((uVar3 == uVar2) &&
         (uVar3 = uVar2,
         puVar6 == (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish)) {
        uVar3 = uVar2 + 1;
        if (0x1f < (int)(uVar2 + 1)) {
          uVar3 = 0x20;
        }
        this->min_bucket = uVar3;
      }
      this->num_elements = this->num_elements - 1;
      this->last_deleted = in_EAX;
      puVar6 = local_48;
    }
  } while (puVar6 == puVar7);
  return in_EAX;
}

Assistant:

unsigned Reap::pop () {
  assert (num_elements > 0);
  unsigned i = min_bucket;
  for (;;) {
    assert (i < 33);
    assert (i <= max_bucket);
    std::vector<unsigned> &s = buckets[i];
    if (s.empty ()) {
      min_bucket = ++i;
      continue;
    }
    unsigned res;
    if (i) {
      res = UINT_MAX;
      const auto begin = std::begin (s);
      const auto end = std::end (s);
      auto q = std::begin (s);
      assert (begin < end);
      for (auto p = begin; p != end; ++p) {
        const unsigned tmp = *p;
        if (tmp >= res)
          continue;
        res = tmp;
        q = p;
      }

      for (auto p = begin; p != end; ++p) {
        if (p == q)
          continue;
        const unsigned other = *p;
        const unsigned diff = other ^ res;
        assert (sizeof (unsigned) == 4);
        const unsigned j = 32 - leading_zeroes_of_unsigned (diff);
        assert (j < i);
        buckets[j].push_back (other);
        if (min_bucket > j)
          min_bucket = j;
      }

      s.clear ();

      if (i && max_bucket == i) {
#ifndef NDEBUG
        for (unsigned j = i + 1; j < 33; j++)
          assert (buckets[j].empty ());
#endif
        if (s.empty ())
          max_bucket = i - 1;
      }
    } else {
      res = last_deleted;
      assert (!buckets[0].empty ());
      assert (buckets[0].at (0) == res);
      buckets[0].pop_back ();
    }

    if (min_bucket == i) {
#ifndef NDEBUG
      for (unsigned j = 0; j < i; j++)
        assert (buckets[j].empty ());
#endif
      if (s.empty ())
        min_bucket = std::min ((int) (i + 1), 32);
    }

    --num_elements;
    assert (last_deleted <= res);
    last_deleted = res;

    return res;
  }
}